

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::UpperTriangularLayerParams::ByteSizeLong(UpperTriangularLayerParams *this)

{
  int iVar1;
  int64 iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  UpperTriangularLayerParams *this_local;
  
  sStack_18 = 0;
  iVar2 = k(this);
  if (iVar2 != 0) {
    iVar2 = k(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar2);
    sStack_18 = sStack_18 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t UpperTriangularLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UpperTriangularLayerParams)
  size_t total_size = 0;

  // int64 k = 1;
  if (this->k() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->k());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}